

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::python::(anonymous_namespace)::PythonGeneratorTest::~PythonGeneratorTest
          (PythonGeneratorTest *this)

{
  CommandLineInterfaceTester::~CommandLineInterfaceTester
            ((CommandLineInterfaceTester *)(this + -0x2d0));
  return;
}

Assistant:

PythonGeneratorTest() {
    auto generator = std::make_unique<Generator>();
    generator->set_opensource_runtime(GetParam());
    RegisterGenerator("--python_out", "--python_opt", std::move(generator),
                      "Python test generator");

    // Generate built-in protos.
    CreateTempFile(
        google::protobuf::DescriptorProto::descriptor()->file()->name(),
        google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
  }